

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::QualifiedDefaultInstanceName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,Options *options)

{
  FileDescriptor *file;
  string local_40;
  
  file = *(FileDescriptor **)(this + 0x10);
  DefaultInstanceName_abi_cxx11_(&local_40,this,descriptor,options);
  QualifiedFileLevelSymbol(__return_storage_ptr__,file,&local_40,(Options *)descriptor);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string QualifiedDefaultInstanceName(const Descriptor* descriptor,
                                         const Options& options) {
  return QualifiedFileLevelSymbol(
      descriptor->file(), DefaultInstanceName(descriptor, options), options);
}